

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.cpp
# Opt level: O1

int mbedtls_pk_parse_public_key(mbedtls_pk_context *ctx,uchar *key,size_t keylen)

{
  int iVar1;
  mbedtls_pk_type_t mVar2;
  mbedtls_pk_info_t *pmVar3;
  mbedtls_rsa_context *pmVar4;
  uchar *p;
  mbedtls_pem_context pem;
  size_t len;
  uchar *local_68;
  mbedtls_pem_context local_60;
  mbedtls_pk_context local_48;
  size_t local_38;
  
  if (keylen == 0) {
    return -0x3d00;
  }
  mbedtls_pem_init(&local_60);
  iVar1 = -0x1080;
  if (key[keylen - 1] == '\0') {
    iVar1 = mbedtls_pem_read_buffer
                      (&local_60,"-----BEGIN RSA PUBLIC KEY-----","-----END RSA PUBLIC KEY-----",key
                       ,(uchar *)0x0,0,&local_38);
  }
  if (iVar1 == -0x1080) {
    iVar1 = -0x1080;
    if ((key + keylen)[-1] == '\0') {
      iVar1 = mbedtls_pem_read_buffer
                        (&local_60,"-----BEGIN PUBLIC KEY-----","-----END PUBLIC KEY-----",key,
                         (uchar *)0x0,0,&local_38);
    }
    if (iVar1 == -0x1080) {
      mbedtls_pem_free(&local_60);
      pmVar3 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
      if (pmVar3 == (mbedtls_pk_info_t *)0x0) {
        return -0x3c80;
      }
      iVar1 = mbedtls_pk_setup(ctx,pmVar3);
      if (iVar1 == 0) {
        local_48.pk_info = ctx->pk_info;
        local_48.pk_ctx = ctx->pk_ctx;
        local_68 = key;
        mVar2 = mbedtls_pk_get_type(&local_48);
        pmVar4 = (mbedtls_rsa_context *)local_48.pk_ctx;
        if (mVar2 != MBEDTLS_PK_RSA) {
          pmVar4 = (mbedtls_rsa_context *)0x0;
        }
        iVar1 = mbedtls_rsa_parse_pubkey(pmVar4,local_68,keylen);
        if (iVar1 != 0) {
          mbedtls_pk_free(ctx);
          if (iVar1 == -0x62) {
            local_68 = key;
            iVar1 = mbedtls_pk_parse_subpubkey(&local_68,key + keylen,ctx);
            return iVar1;
          }
          return iVar1;
        }
        return 0;
      }
      return iVar1;
    }
    if (iVar1 == 0) {
      local_68 = local_60.buf;
      iVar1 = mbedtls_pk_parse_subpubkey(&local_68,local_60.buf + local_60.buflen,ctx);
    }
  }
  else if (iVar1 == 0) {
    local_68 = local_60.buf;
    pmVar3 = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA);
    if (pmVar3 == (mbedtls_pk_info_t *)0x0) {
      mbedtls_pem_free(&local_60);
      return -0x3c80;
    }
    iVar1 = mbedtls_pk_setup(ctx,pmVar3);
    if (iVar1 == 0) {
      local_48.pk_info = ctx->pk_info;
      local_48.pk_ctx = ctx->pk_ctx;
      mVar2 = mbedtls_pk_get_type(&local_48);
      pmVar4 = (mbedtls_rsa_context *)local_48.pk_ctx;
      if (mVar2 != MBEDTLS_PK_RSA) {
        pmVar4 = (mbedtls_rsa_context *)0x0;
      }
      iVar1 = mbedtls_rsa_parse_pubkey(pmVar4,local_68,local_60.buflen);
      if (iVar1 != 0) {
        mbedtls_pk_free(ctx);
      }
    }
  }
  mbedtls_pem_free(&local_60);
  return iVar1;
}

Assistant:

int mbedtls_pk_parse_public_key(mbedtls_pk_context *ctx,
                                const unsigned char *key, size_t keylen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *p;
#if defined(MBEDTLS_RSA_C)
    const mbedtls_pk_info_t *pk_info;
#endif
#if defined(MBEDTLS_PEM_PARSE_C)
    size_t len;
    mbedtls_pem_context pem;
#endif

    if (keylen == 0) {
        return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
    }

#if defined(MBEDTLS_PEM_PARSE_C)
    mbedtls_pem_init(&pem);
#if defined(MBEDTLS_RSA_C)
    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if (key[keylen - 1] != '\0') {
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    } else {
        ret = mbedtls_pem_read_buffer(&pem,
                                      PEM_BEGIN_PUBLIC_KEY_RSA, PEM_END_PUBLIC_KEY_RSA,
                                      key, NULL, 0, &len);
    }

    if (ret == 0) {
        p = pem.buf;
        if ((pk_info = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA)) == NULL) {
            mbedtls_pem_free(&pem);
            return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
        }

        if ((ret = mbedtls_pk_setup(ctx, pk_info)) != 0) {
            mbedtls_pem_free(&pem);
            return ret;
        }

        if ((ret = mbedtls_rsa_parse_pubkey(mbedtls_pk_rsa(*ctx), p, pem.buflen)) != 0) {
            mbedtls_pk_free(ctx);
        }

        mbedtls_pem_free(&pem);
        return ret;
    } else if (ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) {
        mbedtls_pem_free(&pem);
        return ret;
    }
#endif /* MBEDTLS_RSA_C */

    /* Avoid calling mbedtls_pem_read_buffer() on non-null-terminated string */
    if (key[keylen - 1] != '\0') {
        ret = MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    } else {
        ret = mbedtls_pem_read_buffer(&pem,
                                      PEM_BEGIN_PUBLIC_KEY, PEM_END_PUBLIC_KEY,
                                      key, NULL, 0, &len);
    }

    if (ret == 0) {
        /*
         * Was PEM encoded
         */
        p = pem.buf;

        ret = mbedtls_pk_parse_subpubkey(&p, p + pem.buflen, ctx);
        mbedtls_pem_free(&pem);
        return ret;
    } else if (ret != MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) {
        mbedtls_pem_free(&pem);
        return ret;
    }
    mbedtls_pem_free(&pem);
#endif /* MBEDTLS_PEM_PARSE_C */

#if defined(MBEDTLS_RSA_C)
    if ((pk_info = mbedtls_pk_info_from_type(MBEDTLS_PK_RSA)) == NULL) {
        return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
    }

    if ((ret = mbedtls_pk_setup(ctx, pk_info)) != 0) {
        return ret;
    }

    p = (unsigned char *) key;
    ret = mbedtls_rsa_parse_pubkey(mbedtls_pk_rsa(*ctx), p, keylen);
    if (ret == 0) {
        return ret;
    }
    mbedtls_pk_free(ctx);
    if (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) {
        return ret;
    }
#endif /* MBEDTLS_RSA_C */
    p = (unsigned char *) key;

    ret = mbedtls_pk_parse_subpubkey(&p, p + keylen, ctx);

    return ret;
}